

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementFormControl.cpp
# Opt level: O0

void __thiscall Rml::ElementFormControl::SetDisabled(ElementFormControl *this,bool disable)

{
  allocator<char> local_71;
  String local_70;
  allocator<char> local_39;
  String local_38;
  undefined1 local_11;
  ElementFormControl *pEStack_10;
  bool disable_local;
  ElementFormControl *this_local;
  
  local_11 = disable;
  pEStack_10 = this;
  if (disable) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"disabled",&local_39);
    Element::SetAttribute<char[1]>(&this->super_Element,&local_38,(char (*) [1])0x71a7c3);
    ::std::__cxx11::string::~string((string *)&local_38);
    ::std::allocator<char>::~allocator(&local_39);
  }
  else {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"disabled",&local_71);
    Element::RemoveAttribute(&this->super_Element,&local_70);
    ::std::__cxx11::string::~string((string *)&local_70);
    ::std::allocator<char>::~allocator(&local_71);
  }
  return;
}

Assistant:

void ElementFormControl::SetDisabled(bool disable)
{
	if (disable)
		SetAttribute("disabled", "");
	else
		RemoveAttribute("disabled");
}